

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::python::Generator::FixAllDescriptorOptions(Generator *this)

{
  bool bVar1;
  FileDescriptor *pFVar2;
  long lVar3;
  int i;
  long lVar4;
  string file_options;
  allocator<char> local_79;
  string local_78;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"FileOptions",&local_79);
  MessageLite::SerializeAsString_abi_cxx11_(&local_58,*(MessageLite **)(this->file_ + 0xa0));
  OptionsValue(&local_38,this,&local_78,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  bVar1 = std::operator!=(&local_38,"None");
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"DESCRIPTOR",(allocator<char> *)&local_58);
    anon_unknown_0::PrintDescriptorOptionsFixingCode(&local_78,&local_38,this->printer_);
    std::__cxx11::string::~string((string *)&local_78);
  }
  lVar3 = 0;
  for (lVar4 = 0; pFVar2 = this->file_, lVar4 < *(int *)(pFVar2 + 0x68); lVar4 = lVar4 + 1) {
    FixOptionsForEnum(this,(EnumDescriptor *)(*(long *)(pFVar2 + 0x70) + lVar3));
    lVar3 = lVar3 + 0x38;
  }
  lVar3 = 0;
  for (lVar4 = 0; lVar4 < *(int *)(pFVar2 + 0x88); lVar4 = lVar4 + 1) {
    FixOptionsForField(this,(FieldDescriptor *)(*(long *)(pFVar2 + 0x98) + lVar3));
    pFVar2 = this->file_;
    lVar3 = lVar3 + 0xa8;
  }
  lVar3 = 0;
  for (lVar4 = 0; lVar4 < *(int *)(pFVar2 + 0x58); lVar4 = lVar4 + 1) {
    FixOptionsForMessage(this,(Descriptor *)(*(long *)(pFVar2 + 0x60) + lVar3));
    pFVar2 = this->file_;
    lVar3 = lVar3 + 0xa8;
  }
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void Generator::FixAllDescriptorOptions() const {
  // Prints an expression that sets the file descriptor's options.
  string file_options = OptionsValue(
      "FileOptions", file_->options().SerializeAsString());
  if (file_options != "None") {
    PrintDescriptorOptionsFixingCode(kDescriptorKey, file_options, printer_);
  }
  // Prints expressions that set the options for all top level enums.
  for (int i = 0; i < file_->enum_type_count(); ++i) {
    const EnumDescriptor& enum_descriptor = *file_->enum_type(i);
    FixOptionsForEnum(enum_descriptor);
  }
  // Prints expressions that set the options for all top level extensions.
  for (int i = 0; i < file_->extension_count(); ++i) {
    const FieldDescriptor& field = *file_->extension(i);
    FixOptionsForField(field);
  }
  // Prints expressions that set the options for all messages, nested enums,
  // nested extensions and message fields.
  for (int i = 0; i < file_->message_type_count(); ++i) {
    FixOptionsForMessage(*file_->message_type(i));
  }
}